

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_compressionParameters *__return_storage_ptr__,ZSTD_CCtx_params *CCtxParams,
          U64 srcSizeHint,size_t dictSize)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  ZSTD_strategy ZVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ZSTD_compressionParameters cParams;
  ZSTD_compressionParameters cPar;
  uint uVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 local_88;
  undefined4 uStack_84;
  ZSTD_compressionParameters local_4c;
  
  if (srcSizeHint == 0xffffffffffffffff) {
    srcSizeHint = 0xffffffffffffffff;
    if (0 < (long)CCtxParams->srcSizeHint) {
      srcSizeHint = (long)CCtxParams->srcSizeHint;
    }
  }
  ZSTD_getCParams_internal(&local_4c,CCtxParams->compressionLevel,srcSizeHint,dictSize);
  uVar8 = 0x1b;
  if ((CCtxParams->ldmParams).enableLdm == 0) {
    uVar8 = local_4c.windowLog;
  }
  auVar10._8_8_ = 0;
  auVar10._0_4_ = local_4c.minMatch;
  auVar10._4_4_ = local_4c.targetLength;
  auVar5._0_4_ = (CCtxParams->cParams).windowLog;
  auVar5._4_4_ = (CCtxParams->cParams).chainLog;
  auVar5._8_4_ = (CCtxParams->cParams).hashLog;
  auVar5._12_4_ = (CCtxParams->cParams).searchLog;
  auVar6 = vpinsrd_avx(ZEXT416(uVar8),local_4c.chainLog,1);
  auVar7._8_4_ = local_4c.minMatch;
  auVar7._12_4_ = local_4c.targetLength;
  auVar7._0_4_ = local_4c.hashLog;
  auVar7._4_4_ = local_4c.searchLog;
  auVar7 = vpunpcklqdq_avx(auVar6,auVar7);
  auVar6 = vpcmpeqd_avx(auVar5,(undefined1  [16])0x0);
  auVar5 = vblendvps_avx(auVar5,auVar7,auVar6);
  uVar1 = (CCtxParams->cParams).minMatch;
  uVar3 = (CCtxParams->cParams).targetLength;
  auVar11._4_4_ = uVar3;
  auVar11._0_4_ = uVar1;
  auVar11._8_8_ = 0;
  auVar6 = vpcmpeqd_avx(auVar11,(undefined1  [16])0x0);
  auVar6 = vblendvps_avx(auVar11,auVar10,auVar6);
  ZVar4 = (CCtxParams->cParams).strategy;
  if (ZVar4 == 0) {
    ZVar4 = local_4c.strategy;
  }
  uVar2 = vmovlps_avx(auVar6);
  local_88 = (undefined4)uVar2;
  uStack_84 = (undefined4)((ulong)uVar2 >> 0x20);
  cParams.strategy = ZVar4;
  cParams.targetLength = uStack_84;
  cParams.minMatch = local_88;
  cParams.windowLog = auVar5._0_4_;
  cParams.chainLog = auVar5._4_4_;
  cParams.hashLog = auVar5._8_4_;
  cParams.searchLog = auVar5._12_4_;
  sVar9 = ZSTD_checkCParams(cParams);
  if (sVar9 == 0) {
    uVar2 = vmovlps_avx(auVar6);
    local_a8 = (undefined4)uVar2;
    uStack_a4 = (undefined4)((ulong)uVar2 >> 0x20);
    cPar.strategy = ZVar4;
    cPar.targetLength = uStack_a4;
    cPar.minMatch = local_a8;
    cPar.windowLog = auVar5._0_4_;
    cPar.chainLog = auVar5._4_4_;
    cPar.hashLog = auVar5._8_4_;
    cPar.searchLog = auVar5._12_4_;
    ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
    return __return_storage_ptr__;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x2e86,
                "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t)"
               );
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize);
    if (CCtxParams->ldmParams.enableLdm) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    if (CCtxParams->cParams.windowLog) cParams.windowLog = CCtxParams->cParams.windowLog;
    if (CCtxParams->cParams.hashLog) cParams.hashLog = CCtxParams->cParams.hashLog;
    if (CCtxParams->cParams.chainLog) cParams.chainLog = CCtxParams->cParams.chainLog;
    if (CCtxParams->cParams.searchLog) cParams.searchLog = CCtxParams->cParams.searchLog;
    if (CCtxParams->cParams.minMatch) cParams.minMatch = CCtxParams->cParams.minMatch;
    if (CCtxParams->cParams.targetLength) cParams.targetLength = CCtxParams->cParams.targetLength;
    if (CCtxParams->cParams.strategy) cParams.strategy = CCtxParams->cParams.strategy;
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize);
}